

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.c
# Opt level: O0

void lyplg_type_free_bits(ly_ctx *ctx,lyd_value *value)

{
  lyd_value_bits *val;
  lyd_value *value_local;
  ly_ctx *ctx_local;
  
  lydict_remove(ctx,value->_canonical);
  value->_canonical = (char *)0x0;
  if ((&value->field_2 != (anon_union_24_16_e2776397_for_lyd_value_2 *)0x0) &&
     (free((value->field_2).dyn_mem), *(long *)((long)&value->field_2 + 8) != 0)) {
    free((void *)(*(long *)((long)&value->field_2 + 8) + -8));
  }
  return;
}

Assistant:

LIBYANG_API_DEF void
lyplg_type_free_bits(const struct ly_ctx *ctx, struct lyd_value *value)
{
    struct lyd_value_bits *val;

    lydict_remove(ctx, value->_canonical);
    value->_canonical = NULL;
    LYD_VALUE_GET(value, val);
    if (val) {
        free(val->bitmap);
        LY_ARRAY_FREE(val->items);
        LYPLG_TYPE_VAL_INLINE_DESTROY(val);
    }
}